

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csg.cpp
# Opt level: O0

void __thiscall ocmesh::details::intersection_t::dump(intersection_t *this,ostream *o)

{
  object *poVar1;
  ostream *o_local;
  intersection_t *this_local;
  
  std::operator<<(o,"intersect(");
  poVar1 = details::binary_operation_t::left(&this->super_binary_operation_t);
  (*poVar1->_vptr_object[4])(poVar1,o);
  std::operator<<(o,", ");
  poVar1 = details::binary_operation_t::right(&this->super_binary_operation_t);
  (*poVar1->_vptr_object[4])(poVar1,o);
  std::operator<<(o,")");
  return;
}

Assistant:

void intersection_t::dump(std::ostream &o) const {
            o << "intersect(";
            left()->dump(o);
            o << ", ";
            right()->dump(o);
            o << ")";
        }